

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::Unregister
          (SubjectSetRegister *this,Subject *subject_to_unregister)

{
  iterator iVar1;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->mutex_);
  this->modified_ = true;
  iVar1 = std::
          _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
          ::find(&(this->subject_state_)._M_t,subject_to_unregister);
  if (((_Rb_tree_header *)iVar1._M_node ==
       &(this->subject_state_)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar1._M_node[1]._M_right == 1)) {
    std::
    _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
    ::erase(&(this->subject_state_)._M_t,subject_to_unregister);
  }
  else {
    *(undefined4 *)&iVar1._M_node[1]._M_right = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void SubjectSetRegister::Unregister(const Subject& subject_to_unregister)
{
    std::unique_lock<std::mutex> lck(mutex_);
    modified_ = true;

    auto state = subject_state_.find(subject_to_unregister);

    if (state == subject_state_.end() || state->second.GetState() == STATE_NEWLY_SUBSCRIBED)
    {
        ClearSubjectState(subject_to_unregister);
    }
    else
    {
        state->second.SetState(STATE_UNSUBSCRIBED);
    }
}